

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VConst(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_EDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  double dVar2;
  double dVar3;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunrealtype in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar4 = 0;
  set_element_range(in_RSI,(ulong)in_EDX << 0x20,(ulong)in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffd8);
  dVar2 = get_time();
  N_VConst(0x3ff0000000000000,in_RDI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)in_RSI,(N_Vector)CONCAT44(in_EDX,iVar5),
                    CONCAT44(uVar4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VConst \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VConst, Proc %d \n",(ulong)in_EDX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VConst");
  }
  return iVar5;
}

Assistant:

int Test_N_VConst(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /* fill vector data with zeros to prevent passing in the case where
     the input vector is a vector of ones */
  set_element_range(X, 0, local_length - 1, ZERO);

  start_time = get_time();
  N_VConst(ONE, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  failure = check_ans(ONE, X, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VConst, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConst \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConst", maxt);

  return (fails);
}